

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringstorage.c
# Opt level: O1

void * internal_find_add(storage_blocks *sb,string_struct *r,uint8_t prev_bytes,char *s,int doadd)

{
  ulong uVar1;
  size_t *psVar2;
  byte bVar3;
  size_t sVar4;
  byte *pbVar5;
  char *pcVar6;
  char cVar7;
  int iVar8;
  string_struct *psVar9;
  size_t sVar10;
  char *pcVar11;
  char **ppcVar12;
  long lVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  char *local_58;
  byte *local_50;
  
  local_58 = s;
  do {
    sVar4 = r->child_count;
    uVar16 = 0;
    sVar14 = sVar4;
    while (uVar16 < sVar14) {
      uVar15 = sVar14 + uVar16 >> 1;
      pbVar5 = (byte *)r->children[uVar15].value;
      iVar8 = strcmp(local_58,(char *)(pbVar5 + sb->user_data_size + 1));
      bVar3 = *pbVar5;
      if (bVar3 == prev_bytes && iVar8 == 0) {
        local_50 = pbVar5 + 1;
        uVar15 = sVar14;
      }
      else {
        uVar1 = uVar15 + 1;
        if (bVar3 == prev_bytes) {
          if (-1 < iVar8) goto LAB_001013ec;
        }
        else if (prev_bytes <= bVar3) {
LAB_001013ec:
          uVar15 = sVar14;
          uVar16 = uVar1;
        }
      }
      sVar14 = uVar15;
      if (bVar3 == prev_bytes && iVar8 == 0) {
        return local_50;
      }
    }
    uVar15 = 0;
    if ((uVar16 != 0) && (cVar7 = *local_58, cVar7 != '\0')) {
      uVar15 = 0;
      do {
        if (cVar7 != r->children[uVar16 - 1].value[uVar15 + sb->user_data_size + 1]) break;
        cVar7 = local_58[uVar15 + 1];
        uVar15 = uVar15 + 1;
      } while (cVar7 != '\0');
      uVar15 = uVar15 & 0xff;
    }
    if ((uint)uVar15 < 9) {
      if (doadd != 0) {
        psVar9 = (string_struct *)allocate_reallocate_array(r->children,sVar4,0x18);
        r->children = psVar9;
        if (psVar9 != (string_struct *)0x0) {
          lVar13 = r->child_count - uVar16;
          if (lVar13 != 0) {
            memmove(psVar9 + uVar16 + 1,psVar9 + uVar16,lVar13 * 0x18);
          }
          sVar10 = strlen(local_58);
          if ((sb->current == (char *)0x0) ||
             (0x1000 < sb->user_data_size + sb->used_bytes + sVar10 + 2)) {
            pcVar11 = (char *)calloc(1,0x1000);
            ppcVar12 = (char **)allocate_reallocate_array(sb->blocks,sb->block_count,8);
            sb->blocks = ppcVar12;
            if (ppcVar12 == (char **)0x0) {
              return (void *)0x0;
            }
            sVar4 = sb->block_count;
            sb->block_count = sVar4 + 1;
            ppcVar12[sVar4] = pcVar11;
            sb->current = pcVar11;
            sb->used_bytes = 0;
          }
          sVar4 = sb->used_bytes;
          pcVar6 = sb->current;
          pcVar11 = pcVar6 + sVar4;
          psVar9 = r->children;
          psVar9[uVar16].value = pcVar11;
          psVar2 = &psVar9[uVar16].child_count;
          *psVar2 = 0;
          psVar2[1] = 0;
          pcVar6[sVar4] = prev_bytes;
          memcpy(pcVar11 + sb->user_data_size + 1,local_58,sVar10 + 1);
          sb->used_bytes = sb->used_bytes + sb->user_data_size + sVar10 + 2;
          r->child_count = r->child_count + 1;
          return r->children[uVar16].value + 1;
        }
      }
      return (void *)0x0;
    }
    r = r->children + (uVar16 - 1);
    prev_bytes = prev_bytes + (char)uVar15;
    local_58 = local_58 + uVar15;
  } while( true );
}

Assistant:

void *internal_find_add(storage_blocks *sb, struct string_struct *r, uint8_t prev_bytes, const char *s, int doadd)
{
	size_t begin = 0;
	size_t end = r->child_count;
	uint8_t common_bytes = 0;
	size_t len;
	char *newvalue;

	while (begin < end)
	{
		size_t mid = (begin + end) >> 1;
		int res = strcmp(s, r->children[mid].value + sb->user_data_size + 1);
		unsigned char sz_p1 = *(r->children[mid].value);
		if ((res == 0) && (sz_p1 == prev_bytes))
		{
			return (void*)(r->children[mid].value + 1);
		}
		else if (sz_p1 == prev_bytes)
		{
			if (res < 0) end = mid; else begin = mid + 1;
		}
		else
		{
			if (sz_p1 < prev_bytes) end = mid; else begin = mid + 1;
		}
	}

	/* 2. check how many bytes common with previous string */
	if (begin != 0) common_bytes = get_common_prefix_size(s, r->children[begin - 1].value + sb->user_data_size + 1);

	if (common_bytes > 8)
	{
		return internal_find_add(sb, &r->children[begin - 1], prev_bytes + common_bytes, s + common_bytes, doadd);
	}

	if (doadd == 0) return 0;

	/* 3. insert string after begin */
	r->children = allocate_reallocate_array(r->children, r->child_count, sizeof(struct string_struct));
	if (r->children == 0) return 0;
	if (begin != r->child_count)
	{
		memmove(&r->children[begin + 1], &r->children[begin],
		  (r->child_count - begin) * sizeof(struct string_struct));
	}

	len = strlen(s) + 1;
	if ((sb->current == 0) || (sb->used_bytes + 1 + len + sb->user_data_size > STORAGE_BLOCK_SIZE))
	{
		char *newcurrent = (char*)calloc(1, STORAGE_BLOCK_SIZE);
		sb->blocks = allocate_reallocate_array(sb->blocks, sb->block_count, sizeof(char*));
		if (sb->blocks == 0) return 0;

		sb->blocks[sb->block_count++] = newcurrent;
		sb->current = newcurrent;
		sb->used_bytes = 0;
	}

	newvalue = sb->current + sb->used_bytes;
	r->children[begin].value = newvalue;
	r->children[begin].child_count = 0;
	r->children[begin].children = 0;
	*(uint8_t*)(newvalue) = prev_bytes;
	memcpy(newvalue + sb->user_data_size + 1, s, len);
	sb->used_bytes += sb->user_data_size + 1 + len;
	r->child_count++;
	return (void*)(r->children[begin].value + 1);
}